

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sni_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  pointer __str;
  uchar *data;
  size_t len;
  char *extraout_RDX;
  string_view s;
  Span<const_unsigned_char> SVar4;
  undefined1 local_f8 [8];
  CBB name;
  CBB server_name_list;
  CBB contents;
  size_t local_60;
  uchar *local_58;
  uchar *local_50;
  undefined1 local_48 [8];
  Span<const_unsigned_char> hostname;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  hostname.size_ = (size_t)hs->ssl;
  Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_48);
  if (type == ssl_client_hello_outer) {
    pEVar3 = std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator->
                       (&hs->selected_ech_config);
    local_48 = (undefined1  [8])(pEVar3->public_name).data_;
    hostname.data_ = (uchar *)(pEVar3->public_name).size_;
  }
  else {
    bVar1 = std::operator==((unique_ptr<char,_bssl::internal::Deleter> *)(hostname.size_ + 0x90),
                            (nullptr_t)0x0);
    if (bVar1) {
      return true;
    }
    __str = std::unique_ptr<char,_bssl::internal::Deleter>::get
                      ((unique_ptr<char,_bssl::internal::Deleter> *)(hostname.size_ + 0x90));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&contents.u + 0x18),__str)
    ;
    s._M_str = extraout_RDX;
    s._M_len = local_60;
    SVar4 = StringAsBytes((bssl *)contents.u._24_8_,s);
    local_58 = SVar4.data_;
    local_48 = (undefined1  [8])local_58;
    local_50 = (uchar *)SVar4.size_;
    hostname.data_ = local_50;
  }
  iVar2 = CBB_add_u16(out,0);
  if ((((iVar2 != 0) &&
       (iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&server_name_list.u + 0x18)),
       iVar2 != 0)) &&
      (iVar2 = CBB_add_u16_length_prefixed
                         ((CBB *)((long)&server_name_list.u + 0x18),(CBB *)((long)&name.u + 0x18)),
      iVar2 != 0)) &&
     ((iVar2 = CBB_add_u8((CBB *)((long)&name.u + 0x18),'\0'), iVar2 != 0 &&
      (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&name.u + 0x18),(CBB *)local_f8),
      iVar2 != 0)))) {
    data = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_48);
    len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_48);
    iVar2 = CBB_add_bytes((CBB *)local_f8,data,len);
    if ((iVar2 != 0) && (iVar2 = CBB_flush(out), iVar2 != 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool ext_sni_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // If offering ECH, send the public name instead of the configured name.
  Span<const uint8_t> hostname;
  if (type == ssl_client_hello_outer) {
    hostname = hs->selected_ech_config->public_name;
  } else {
    if (ssl->hostname == nullptr) {
      return true;
    }
    hostname = StringAsBytes(ssl->hostname.get());
  }

  CBB contents, server_name_list, name;
  if (!CBB_add_u16(out, TLSEXT_TYPE_server_name) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &server_name_list) ||
      !CBB_add_u8(&server_name_list, TLSEXT_NAMETYPE_host_name) ||
      !CBB_add_u16_length_prefixed(&server_name_list, &name) ||
      !CBB_add_bytes(&name, hostname.data(), hostname.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}